

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> __thiscall
cmList::TransformSelector::NewAT
          (TransformSelector *this,vector<long,_std::allocator<long>_> *indexes)

{
  vector<long,_std::allocator<long>_> *local_18;
  vector<long,_std::allocator<long>_> *indexes_local;
  
  local_18 = indexes;
  indexes_local = (vector<long,_std::allocator<long>_> *)this;
  std::
  make_unique<(anonymous_namespace)::TransformSelectorAt,std::vector<long,std::allocator<long>>const&>
            ((vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffe0);
  std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>::
  unique_ptr<(anonymous_namespace)::TransformSelectorAt,std::default_delete<(anonymous_namespace)::TransformSelectorAt>,void>
            ((unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>> *
             )this,(unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
                    *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
          )(__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewAT(
  std::vector<index_type> const& indexes)
{
  return cm::make_unique<TransformSelectorAt>(indexes);
}